

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyCylinder::ChBodyEasyCylinder
          (ChBodyEasyCylinder *this,double radius,double height,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,ChCollisionSystemType collision_type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChMaterialSurface> local_48;
  double local_30;
  double local_28;
  double local_20;
  
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b04a88;
  local_30 = radius;
  local_28 = height;
  local_20 = density;
  ChBody::ChBody(&this->super_ChBody,&PTR_construction_vtable_24__00b07120,collision_type);
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0xb06bc0;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0xb06ec0;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0xb06f58;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)0xb07090;
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  SetupBody(this,local_30,local_28,local_20,true,true,&local_48);
  if (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

ChBodyEasyCylinder::ChBodyEasyCylinder(double radius,
                                       double height,
                                       double density,
                                       std::shared_ptr<ChMaterialSurface> material,
                                       collision::ChCollisionSystemType collision_type)
    : ChBody(collision_type) {
    SetupBody(radius, height, density, true, true, material);
}